

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

void __thiscall chaiscript::ChaiScript_Basic::set_state(ChaiScript_Basic *this,State *t_state)

{
  undefined1 local_30 [8];
  shared_lock<chaiscript::detail::threading::shared_mutex> l2;
  lock_guard<chaiscript::detail::threading::recursive_mutex> l;
  State *t_state_local;
  ChaiScript_Basic *this_local;
  
  Catch::clara::std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&l2._M_owns,&this->m_use_mutex);
  Catch::clara::std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_30,&this->m_mutex);
  Catch::clara::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_used_files,&t_state->used_files);
  Catch::clara::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_active_loaded_modules,&t_state->active_loaded_modules);
  detail::Dispatch_Engine::set_state(&this->m_engine,&t_state->engine_state);
  Catch::clara::std::shared_lock<std::shared_mutex>::~shared_lock
            ((shared_lock<std::shared_mutex> *)local_30);
  Catch::clara::std::lock_guard<std::recursive_mutex>::~lock_guard
            ((lock_guard<std::recursive_mutex> *)&l2._M_owns);
  return;
}

Assistant:

void set_state(const State &t_state) {
      chaiscript::detail::threading::lock_guard<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l2(m_mutex);

      m_used_files = t_state.used_files;
      m_active_loaded_modules = t_state.active_loaded_modules;
      m_engine.set_state(t_state.engine_state);
    }